

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::anon_unknown_0::Parser::parseTerminalBracketsOrUnary(Parser *this)

{
  bool bVar1;
  undefined8 uVar2;
  LiteralString *pLVar3;
  ostream *poVar4;
  long in_RDI;
  AST **unaff_retaddr;
  Parser *in_stack_00000008;
  Token bracket_r_2;
  Token field_id;
  Fodder id_fodder;
  Identifier *id;
  AST *index;
  Token next_1;
  Token close;
  AST *inner;
  Token comma_1;
  AST *expr_1;
  stringstream ss_1;
  Token bracket_r_1;
  Elements elements;
  Token last;
  vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
  specs;
  Token for_token;
  Token comma;
  Fodder comma_fodder;
  bool got_comma;
  AST *first;
  Token bracket_r;
  Token next;
  AST *obj;
  AST *expr;
  stringstream ss;
  UnaryOp uop;
  Token tok;
  Token *in_stack_ffffffffffffe968;
  Token *in_stack_ffffffffffffe970;
  Token *in_stack_ffffffffffffe978;
  string *in_stack_ffffffffffffe980;
  LocationRange *in_stack_ffffffffffffe988;
  StaticError *in_stack_ffffffffffffe990;
  Token *in_stack_ffffffffffffe998;
  Token *in_stack_ffffffffffffe9a0;
  allocator<char> *__a;
  Allocator *in_stack_ffffffffffffe9a8;
  char *__s;
  AST *in_stack_ffffffffffffe9b0;
  LocationRange *in_stack_ffffffffffffe9b8;
  Allocator *in_stack_ffffffffffffe9c0;
  undefined4 in_stack_ffffffffffffe9c8;
  undefined4 in_stack_ffffffffffffe9cc;
  Allocator *in_stack_ffffffffffffe9d0;
  Parser *in_stack_ffffffffffffe9d8;
  vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
  *in_stack_ffffffffffffe9e0;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_ffffffffffffe9e8;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_ffffffffffffea08;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_ffffffffffffea10;
  char (*in_stack_ffffffffffffea28) [1];
  TokenKind *in_stack_ffffffffffffea30;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_ffffffffffffea38;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_ffffffffffffea40;
  LocationRange *in_stack_ffffffffffffea48;
  Allocator *in_stack_ffffffffffffea50;
  Allocator *this_00;
  char (*in_stack_ffffffffffffea60) [1];
  string *in_stack_ffffffffffffeb48;
  Token *in_stack_ffffffffffffeb50;
  Parser *in_stack_ffffffffffffeb58;
  char local_13f9 [321];
  char *in_stack_ffffffffffffed48;
  Kind in_stack_ffffffffffffed54;
  Parser *in_stack_ffffffffffffed58;
  int local_1210;
  vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
  *in_stack_ffffffffffffeed0;
  Fodder *in_stack_ffffffffffffeed8;
  Kind in_stack_ffffffffffffeee4;
  Parser *in_stack_ffffffffffffeee8;
  stringstream local_b58 [16];
  ostream local_b48 [752];
  Token local_858 [3];
  byte local_5e9;
  AST *local_5e8;
  undefined1 local_5d9;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  int local_4b8;
  LiteralString *local_338;
  int local_32c;
  AST *local_2e8;
  undefined1 local_2d9;
  stringstream local_2b8 [16];
  ostream local_2a8 [382];
  undefined1 local_12a;
  undefined1 local_105;
  undefined4 local_d0;
  undefined1 local_c8 [120];
  allocator<char> local_50 [72];
  Token *in_stack_fffffffffffffff8;
  
  pop((Parser *)in_stack_ffffffffffffe988);
  switch(local_d0) {
  case 0:
    parseObjectRemainder(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8);
    Token::~Token(in_stack_ffffffffffffe970);
    local_32c = 1;
    pLVar3 = local_338;
    break;
  case 1:
  case 3:
  case 4:
  case 6:
  case 8:
  case 9:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1f:
  case 0x20:
    local_105 = 1;
    uVar2 = __cxa_allocate_exception(0x60);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe9b0,(char *)in_stack_ffffffffffffe9a8,
               (allocator<char> *)in_stack_ffffffffffffe9a0);
    unexpected(in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb48);
    local_105 = 0;
    __cxa_throw(uVar2,&StaticError::typeinfo,StaticError::~StaticError);
  case 2:
    peek((Parser *)0x1e5919);
    Token::Token(in_stack_ffffffffffffe9a0,in_stack_ffffffffffffe998);
    if (local_4b8 == 3) {
      pop((Parser *)in_stack_ffffffffffffe988);
      span(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
      local_5d8 = 0;
      uStack_5d0 = 0;
      local_5c8 = 0;
      std::
      vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
      ::vector((vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                *)0x1e59bf);
      local_5d9 = 0;
      pLVar3 = (LiteralString *)
               Allocator::
               make<jsonnet::internal::Array,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::Array::Element,std::allocator<jsonnet::internal::Array::Element>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                         (in_stack_ffffffffffffe9c0,in_stack_ffffffffffffe9b8,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)in_stack_ffffffffffffe9b0,
                          (vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                           *)in_stack_ffffffffffffe9a8,(bool *)in_stack_ffffffffffffe9a0,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)in_stack_ffffffffffffe998);
      std::
      vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
      ::~vector((vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                 *)in_stack_ffffffffffffe980);
      LocationRange::~LocationRange((LocationRange *)0x1e5a30);
      local_32c = 1;
      Token::~Token(in_stack_ffffffffffffe970);
    }
    else {
      local_5e8 = parse(in_stack_ffffffffffffe9d8,(uint)((ulong)in_stack_ffffffffffffe9d0 >> 0x20));
      local_5e9 = 0;
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)0x1e5afd);
      peek((Parser *)0x1e5b0a);
      Token::operator=(in_stack_ffffffffffffe970,in_stack_ffffffffffffe968);
      if (((local_5e9 & 1) == 0) && (local_4b8 == 4)) {
        pop((Parser *)in_stack_ffffffffffffe988);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::operator=(in_stack_ffffffffffffea10,in_stack_ffffffffffffea08);
        peek((Parser *)0x1e5b73);
        Token::operator=(in_stack_ffffffffffffe970,in_stack_ffffffffffffe968);
        local_5e9 = 1;
        Token::~Token(in_stack_ffffffffffffe970);
      }
      if (local_4b8 == 0x16) {
        pop((Parser *)in_stack_ffffffffffffe988);
        std::
        vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
        ::vector((vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                  *)0x1e5c0d);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)in_stack_ffffffffffffe9c0,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)in_stack_ffffffffffffe9b8);
        parseComprehensionSpecs
                  (in_stack_ffffffffffffeee8,in_stack_ffffffffffffeee4,in_stack_ffffffffffffeed8,
                   in_stack_ffffffffffffeed0);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)in_stack_ffffffffffffe980);
        span(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
        in_stack_ffffffffffffe970 = local_858;
        pLVar3 = (LiteralString *)
                 Allocator::
                 make<jsonnet::internal::ArrayComprehension,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,bool&,std::vector<jsonnet::internal::ComprehensionSpec,std::allocator<jsonnet::internal::ComprehensionSpec>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                           (in_stack_ffffffffffffe9d0,
                            (LocationRange *)
                            CONCAT44(in_stack_ffffffffffffe9cc,in_stack_ffffffffffffe9c8),
                            (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)in_stack_ffffffffffffe9c0,(AST **)in_stack_ffffffffffffe9b8,
                            (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)in_stack_ffffffffffffe9b0,(bool *)in_stack_ffffffffffffe9a8,
                            in_stack_ffffffffffffe9e0,in_stack_ffffffffffffe9e8);
        LocationRange::~LocationRange((LocationRange *)0x1e5d06);
        local_32c = 1;
        Token::~Token(in_stack_ffffffffffffe970);
        std::
        vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
        ::~vector((vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                   *)in_stack_ffffffffffffe980);
        Token::~Token(in_stack_ffffffffffffe970);
      }
      else {
        std::
        vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
        ::vector((vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                  *)0x1e5dee);
        std::
        vector<jsonnet::internal::Array::Element,std::allocator<jsonnet::internal::Array::Element>>
        ::
        emplace_back<jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                  ((vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                    *)in_stack_ffffffffffffe980,(AST **)in_stack_ffffffffffffe978,
                   (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                    *)in_stack_ffffffffffffe970);
        while (local_4b8 != 3) {
          if ((local_5e9 & 1) == 0) {
            std::__cxx11::stringstream::stringstream(local_b58);
            std::operator<<(local_b48,"expected a comma before next array element.");
            uVar2 = __cxa_allocate_exception(0x60);
            std::__cxx11::stringstream::str();
            StaticError::StaticError
                      (in_stack_ffffffffffffe990,in_stack_ffffffffffffe988,in_stack_ffffffffffffe980
                      );
            __cxa_throw(uVar2,&StaticError::typeinfo,StaticError::~StaticError);
          }
          parse(in_stack_ffffffffffffe9d8,(uint)((ulong)in_stack_ffffffffffffe9d0 >> 0x20));
          std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::clear((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)0x1e60b0);
          local_5e9 = 0;
          peek((Parser *)0x1e60c5);
          Token::operator=(in_stack_ffffffffffffe970,in_stack_ffffffffffffe968);
          if (local_4b8 == 4) {
            pop((Parser *)in_stack_ffffffffffffe988);
            std::
            vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            ::operator=(in_stack_ffffffffffffea10,in_stack_ffffffffffffea08);
            peek((Parser *)0x1e6120);
            Token::operator=(in_stack_ffffffffffffe970,in_stack_ffffffffffffe968);
            local_5e9 = 1;
            Token::~Token(in_stack_ffffffffffffe970);
          }
          std::
          vector<jsonnet::internal::Array::Element,std::allocator<jsonnet::internal::Array::Element>>
          ::
          emplace_back<jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                    ((vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                      *)in_stack_ffffffffffffe980,(AST **)in_stack_ffffffffffffe978,
                     (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                      *)in_stack_ffffffffffffe970);
        }
        pop((Parser *)in_stack_ffffffffffffe988);
        span(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
        pLVar3 = (LiteralString *)
                 Allocator::
                 make<jsonnet::internal::Array,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::Array::Element,std::allocator<jsonnet::internal::Array::Element>>&,bool&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                           (in_stack_ffffffffffffe9c0,in_stack_ffffffffffffe9b8,
                            (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)in_stack_ffffffffffffe9b0,
                            (vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                             *)in_stack_ffffffffffffe9a8,(bool *)in_stack_ffffffffffffe9a0,
                            (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)in_stack_ffffffffffffe998);
        LocationRange::~LocationRange((LocationRange *)0x1e5ec3);
        local_32c = 1;
        Token::~Token(in_stack_ffffffffffffe970);
        std::
        vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
        ::~vector((vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                   *)in_stack_ffffffffffffe980);
      }
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)in_stack_ffffffffffffe980);
    }
    Token::~Token(in_stack_ffffffffffffe970);
    if (local_32c != 0) break;
  case 7:
    parse(in_stack_ffffffffffffe9d8,(uint)((ulong)in_stack_ffffffffffffe9d0 >> 0x20));
    popExpect(in_stack_ffffffffffffed58,in_stack_ffffffffffffed54,in_stack_ffffffffffffed48);
    span(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970);
    pLVar3 = (LiteralString *)
             Allocator::
             make<jsonnet::internal::Parens,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                       ((Allocator *)in_stack_ffffffffffffe9b0,
                        (LocationRange *)in_stack_ffffffffffffe9a8,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)in_stack_ffffffffffffe9a0,(AST **)in_stack_ffffffffffffe998,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)in_stack_ffffffffffffe990);
    LocationRange::~LocationRange((LocationRange *)0x1e62b4);
    local_32c = 1;
    Token::~Token(in_stack_ffffffffffffe970);
    break;
  case 5:
    span(in_stack_ffffffffffffe968);
    pLVar3 = (LiteralString *)
             Allocator::
             make<jsonnet::internal::Dollar,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                       ((Allocator *)in_stack_ffffffffffffe9a0,
                        (LocationRange *)in_stack_ffffffffffffe998,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)in_stack_ffffffffffffe990);
    LocationRange::~LocationRange((LocationRange *)0x1e6c2e);
    local_32c = 1;
    break;
  case 10:
    span(in_stack_ffffffffffffe968);
    Token::data32_abi_cxx11_(in_stack_ffffffffffffe968);
    Allocator::makeIdentifier(in_stack_ffffffffffffe9a8,(UString *)in_stack_ffffffffffffe9a0);
    pLVar3 = (LiteralString *)
             Allocator::
             make<jsonnet::internal::Var,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*>
                       ((Allocator *)in_stack_ffffffffffffe9b0,
                        (LocationRange *)in_stack_ffffffffffffe9a8,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)in_stack_ffffffffffffe9a0,(Identifier **)in_stack_ffffffffffffe998);
    std::__cxx11::u32string::~u32string
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               in_stack_ffffffffffffe970);
    LocationRange::~LocationRange((LocationRange *)0x1e6d4c);
    local_32c = 1;
    break;
  case 0xb:
    span(in_stack_ffffffffffffe968);
    pLVar3 = (LiteralString *)
             Allocator::
             make<jsonnet::internal::LiteralNumber,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::__cxx11::string&>
                       ((Allocator *)in_stack_ffffffffffffe9b0,
                        (LocationRange *)in_stack_ffffffffffffe9a8,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)in_stack_ffffffffffffe9a0,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_ffffffffffffe998);
    LocationRange::~LocationRange((LocationRange *)0x1e63bd);
    local_32c = 1;
    break;
  case 0xc:
    bVar1 = op_is_unary((string *)in_stack_ffffffffffffe978,&in_stack_ffffffffffffe970->kind);
    if (!bVar1) {
      std::__cxx11::stringstream::stringstream(local_2b8);
      poVar4 = std::operator<<(local_2a8,"not a unary operator: ");
      std::operator<<(poVar4,(string *)(local_c8 + 0x18));
      local_2d9 = 1;
      uVar2 = __cxa_allocate_exception(0x60);
      std::__cxx11::stringstream::str();
      StaticError::StaticError
                (in_stack_ffffffffffffe990,in_stack_ffffffffffffe988,in_stack_ffffffffffffe980);
      local_2d9 = 0;
      __cxa_throw(uVar2,&StaticError::typeinfo,StaticError::~StaticError);
    }
    local_2e8 = parse(in_stack_ffffffffffffe9d8,(uint)((ulong)in_stack_ffffffffffffe9d0 >> 0x20));
    span(in_stack_ffffffffffffe978,(AST *)in_stack_ffffffffffffe970);
    pLVar3 = (LiteralString *)
             Allocator::
             make<jsonnet::internal::Unary,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::UnaryOp&,jsonnet::internal::AST*&>
                       ((Allocator *)in_stack_ffffffffffffe9b0,
                        (LocationRange *)in_stack_ffffffffffffe9a8,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)in_stack_ffffffffffffe9a0,&in_stack_ffffffffffffe998->kind,
                        (AST **)in_stack_ffffffffffffe990);
    LocationRange::~LocationRange((LocationRange *)0x1e5882);
    local_32c = 1;
    break;
  case 0xd:
    span(in_stack_ffffffffffffe968);
    Token::data32_abi_cxx11_(in_stack_ffffffffffffe968);
    pLVar3 = Allocator::
             make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::__cxx11::u32string,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                       (in_stack_ffffffffffffea50,in_stack_ffffffffffffea48,
                        in_stack_ffffffffffffea40,in_stack_ffffffffffffea38,
                        in_stack_ffffffffffffea30,in_stack_ffffffffffffea28,
                        in_stack_ffffffffffffea60);
    std::__cxx11::u32string::~u32string
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               in_stack_ffffffffffffe970);
    LocationRange::~LocationRange((LocationRange *)0x1e65e2);
    local_32c = 1;
    break;
  case 0xe:
    span(in_stack_ffffffffffffe968);
    Token::data32_abi_cxx11_(in_stack_ffffffffffffe968);
    pLVar3 = Allocator::
             make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::__cxx11::u32string,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                       (in_stack_ffffffffffffea50,in_stack_ffffffffffffea48,
                        in_stack_ffffffffffffea40,in_stack_ffffffffffffea38,
                        in_stack_ffffffffffffea30,in_stack_ffffffffffffea28,
                        in_stack_ffffffffffffea60);
    std::__cxx11::u32string::~u32string
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               in_stack_ffffffffffffe970);
    LocationRange::~LocationRange((LocationRange *)0x1e64be);
    local_32c = 1;
    break;
  case 0xf:
    span(in_stack_ffffffffffffe968);
    Token::data32_abi_cxx11_(in_stack_ffffffffffffe968);
    pLVar3 = Allocator::
             make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::__cxx11::u32string,jsonnet::internal::LiteralString::TokenKind,std::__cxx11::string&,std::__cxx11::string&>
                       (in_stack_ffffffffffffe9c0,in_stack_ffffffffffffe9b8,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)in_stack_ffffffffffffe9b0,
                        (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                         *)in_stack_ffffffffffffe9a8,&in_stack_ffffffffffffe9a0->kind,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_ffffffffffffe998,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_ffffffffffffe9d0);
    std::__cxx11::u32string::~u32string
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               in_stack_ffffffffffffe970);
    LocationRange::~LocationRange((LocationRange *)0x1e670f);
    local_32c = 1;
    break;
  case 0x10:
    span(in_stack_ffffffffffffe968);
    Token::data32_abi_cxx11_(in_stack_ffffffffffffe968);
    pLVar3 = Allocator::
             make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::__cxx11::u32string,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                       (in_stack_ffffffffffffea50,in_stack_ffffffffffffea48,
                        in_stack_ffffffffffffea40,in_stack_ffffffffffffea38,
                        in_stack_ffffffffffffea30,in_stack_ffffffffffffea28,
                        in_stack_ffffffffffffea60);
    std::__cxx11::u32string::~u32string
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               in_stack_ffffffffffffe970);
    LocationRange::~LocationRange((LocationRange *)0x1e6833);
    local_32c = 1;
    break;
  case 0x11:
    span(in_stack_ffffffffffffe968);
    this_00 = (Allocator *)local_c8;
    Token::data32_abi_cxx11_(in_stack_ffffffffffffe968);
    pLVar3 = Allocator::
             make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::__cxx11::u32string,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                       (this_00,in_stack_ffffffffffffea48,in_stack_ffffffffffffea40,
                        in_stack_ffffffffffffea38,in_stack_ffffffffffffea30,
                        in_stack_ffffffffffffea28,in_stack_ffffffffffffea60);
    std::__cxx11::u32string::~u32string
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               in_stack_ffffffffffffe970);
    LocationRange::~LocationRange((LocationRange *)0x1e6957);
    local_32c = 1;
    break;
  case 0x15:
    span(in_stack_ffffffffffffe968);
    pLVar3 = (LiteralString *)
             Allocator::
             make<jsonnet::internal::LiteralBoolean,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,bool>
                       ((Allocator *)in_stack_ffffffffffffe9b0,
                        (LocationRange *)in_stack_ffffffffffffe9a8,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)in_stack_ffffffffffffe9a0,(bool *)in_stack_ffffffffffffe998);
    LocationRange::~LocationRange((LocationRange *)0x1e6a2f);
    local_32c = 1;
    break;
  case 0x1e:
    span(in_stack_ffffffffffffe968);
    pLVar3 = (LiteralString *)
             Allocator::
             make<jsonnet::internal::LiteralNull,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                       ((Allocator *)in_stack_ffffffffffffe9a0,
                        (LocationRange *)in_stack_ffffffffffffe998,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)in_stack_ffffffffffffe990);
    LocationRange::~LocationRange((LocationRange *)0x1e6b89);
    local_32c = 1;
    break;
  case 0x21:
    span(in_stack_ffffffffffffe968);
    pLVar3 = (LiteralString *)
             Allocator::
             make<jsonnet::internal::Self,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                       ((Allocator *)in_stack_ffffffffffffe9a0,
                        (LocationRange *)in_stack_ffffffffffffe998,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)in_stack_ffffffffffffe990);
    LocationRange::~LocationRange((LocationRange *)0x1e6e08);
    local_32c = 1;
    break;
  case 0x22:
    pop((Parser *)in_stack_ffffffffffffe988);
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)0x1e6e7a);
    if (local_1210 == 2) {
      in_stack_ffffffffffffe9b0 =
           parse(in_stack_ffffffffffffe9d8,(uint)((ulong)in_stack_ffffffffffffe9d0 >> 0x20));
      popExpect(in_stack_ffffffffffffed58,in_stack_ffffffffffffed54,in_stack_ffffffffffffed48);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      operator=(in_stack_ffffffffffffea10,in_stack_ffffffffffffea08);
      Token::~Token(in_stack_ffffffffffffe970);
    }
    else {
      if (local_1210 != 6) {
        uVar2 = __cxa_allocate_exception(0x60);
        __a = local_50;
        __s = local_13f9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe9b0,__s,__a);
        StaticError::StaticError
                  (in_stack_ffffffffffffe990,in_stack_ffffffffffffe988,in_stack_ffffffffffffe980);
        __cxa_throw(uVar2,&StaticError::typeinfo,StaticError::~StaticError);
      }
      popExpect(in_stack_ffffffffffffed58,in_stack_ffffffffffffed54,in_stack_ffffffffffffed48);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      operator=(in_stack_ffffffffffffea10,in_stack_ffffffffffffea08);
      in_stack_ffffffffffffe9c0 = *(Allocator **)(in_RDI + 8);
      Token::data32_abi_cxx11_(in_stack_ffffffffffffe968);
      in_stack_ffffffffffffe9b8 =
           (LocationRange *)
           Allocator::makeIdentifier(in_stack_ffffffffffffe9a8,(UString *)in_stack_ffffffffffffe9a0)
      ;
      std::__cxx11::u32string::~u32string
                ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 in_stack_ffffffffffffe970);
      Token::~Token(in_stack_ffffffffffffe970);
    }
    span(in_stack_ffffffffffffe968);
    pLVar3 = (LiteralString *)
             Allocator::
             make<jsonnet::internal::SuperIndex,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*&>
                       (in_stack_ffffffffffffe9c0,in_stack_ffffffffffffe9b8,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)in_stack_ffffffffffffe9b0,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)in_stack_ffffffffffffe9a8,(AST **)in_stack_ffffffffffffe9a0,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)in_stack_ffffffffffffe998,(Identifier **)in_stack_ffffffffffffe9d0);
    LocationRange::~LocationRange((LocationRange *)0x1e71b1);
    local_32c = 1;
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)in_stack_ffffffffffffe980);
    Token::~Token(in_stack_ffffffffffffe970);
    break;
  case 0x23:
    span(in_stack_ffffffffffffe968);
    pLVar3 = (LiteralString *)
             Allocator::
             make<jsonnet::internal::LiteralBoolean,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,bool>
                       ((Allocator *)in_stack_ffffffffffffe9b0,
                        (LocationRange *)in_stack_ffffffffffffe9a8,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)in_stack_ffffffffffffe9a0,(bool *)in_stack_ffffffffffffe998);
    LocationRange::~LocationRange((LocationRange *)0x1e6ae4);
    local_32c = 1;
    break;
  case 0x24:
    local_12a = 1;
    uVar2 = __cxa_allocate_exception(0x60);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe9b0,(char *)in_stack_ffffffffffffe9a8,
               (allocator<char> *)in_stack_ffffffffffffe9a0);
    StaticError::StaticError
              (in_stack_ffffffffffffe990,in_stack_ffffffffffffe988,in_stack_ffffffffffffe980);
    local_12a = 0;
    __cxa_throw(uVar2,&StaticError::typeinfo,StaticError::~StaticError);
  default:
    std::operator<<((ostream *)&std::cerr,"INTERNAL ERROR: Unknown tok kind: ");
    poVar4 = internal::operator<<
                       ((ostream *)in_stack_ffffffffffffe970,
                        (Kind)((ulong)in_stack_ffffffffffffe968 >> 0x20));
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    abort();
  }
  Token::~Token(in_stack_ffffffffffffe970);
  return &pLVar3->super_AST;
}

Assistant:

AST *parseTerminalBracketsOrUnary(void)
    {
        Token tok = pop();
        switch (tok.kind) {
            case Token::ASSERT:
            case Token::BRACE_R:
            case Token::BRACKET_R:
            case Token::COMMA:
            case Token::DOT:
            case Token::ELSE:
            case Token::ERROR:
            case Token::FOR:
            case Token::FUNCTION:
            case Token::IF:
            case Token::IN:
            case Token::IMPORT:
            case Token::IMPORTSTR:
            case Token::IMPORTBIN:
            case Token::LOCAL:
            case Token::PAREN_R:
            case Token::SEMICOLON:
            case Token::TAILSTRICT:
            case Token::THEN: throw unexpected(tok, "parsing terminal");

            case Token::END_OF_FILE: throw StaticError(tok.location, "unexpected end of file.");

            case Token::OPERATOR: {
                UnaryOp uop;
                if (!op_is_unary(tok.data, uop)) {
                    std::stringstream ss;
                    ss << "not a unary operator: " << tok.data;
                    throw StaticError(tok.location, ss.str());
                }
                AST *expr = parse(UNARY_PRECEDENCE);
                return alloc->make<Unary>(span(tok, expr), tok.fodder, uop, expr);
            }
            case Token::BRACE_L: {
                AST *obj;
                parseObjectRemainder(obj, tok);
                return obj;
            }

            case Token::BRACKET_L: {
                Token next = peek();
                if (next.kind == Token::BRACKET_R) {
                    Token bracket_r = pop();
                    return alloc->make<Array>(
                        span(tok, next), tok.fodder, Array::Elements{}, false, bracket_r.fodder);
                }
                AST *first = parse(MAX_PRECEDENCE);
                bool got_comma = false;
                Fodder comma_fodder;
                next = peek();
                if (!got_comma && next.kind == Token::COMMA) {
                    Token comma = pop();
                    comma_fodder = comma.fodder;
                    next = peek();
                    got_comma = true;
                }

                if (next.kind == Token::FOR) {
                    // It's a comprehension
                    Token for_token = pop();
                    std::vector<ComprehensionSpec> specs;
                    Token last = parseComprehensionSpecs(Token::BRACKET_R, for_token.fodder, specs);
                    return alloc->make<ArrayComprehension>(span(tok, last),
                                                           tok.fodder,
                                                           first,
                                                           comma_fodder,
                                                           got_comma,
                                                           specs,
                                                           last.fodder);
                }

                // Not a comprehension: It can have more elements.
                Array::Elements elements;
                elements.emplace_back(first, comma_fodder);
                do {
                    if (next.kind == Token::BRACKET_R) {
                        Token bracket_r = pop();
                        return alloc->make<Array>(
                            span(tok, next), tok.fodder, elements, got_comma, bracket_r.fodder);
                    }
                    if (!got_comma) {
                        std::stringstream ss;
                        ss << "expected a comma before next array element.";
                        throw StaticError(next.location, ss.str());
                    }
                    AST *expr = parse(MAX_PRECEDENCE);
                    comma_fodder.clear();
                    got_comma = false;
                    next = peek();
                    if (next.kind == Token::COMMA) {
                        Token comma = pop();
                        comma_fodder = comma.fodder;
                        next = peek();
                        got_comma = true;
                    }
                    elements.emplace_back(expr, comma_fodder);
                } while (true);
            }

            case Token::PAREN_L: {
                auto *inner = parse(MAX_PRECEDENCE);
                Token close = popExpect(Token::PAREN_R);
                return alloc->make<Parens>(span(tok, close), tok.fodder, inner, close.fodder);
            }

            // Literals
            case Token::NUMBER: return alloc->make<LiteralNumber>(span(tok), tok.fodder, tok.data);

            case Token::STRING_SINGLE:
                return alloc->make<LiteralString>(
                    span(tok), tok.fodder, tok.data32(), LiteralString::SINGLE, "", "");
            case Token::STRING_DOUBLE:
                return alloc->make<LiteralString>(
                    span(tok), tok.fodder, tok.data32(), LiteralString::DOUBLE, "", "");
            case Token::STRING_BLOCK:
                return alloc->make<LiteralString>(span(tok),
                                                  tok.fodder,
                                                  tok.data32(),
                                                  LiteralString::BLOCK,
                                                  tok.stringBlockIndent,
                                                  tok.stringBlockTermIndent);
            case Token::VERBATIM_STRING_SINGLE:
                return alloc->make<LiteralString>(
                    span(tok), tok.fodder, tok.data32(), LiteralString::VERBATIM_SINGLE, "", "");
            case Token::VERBATIM_STRING_DOUBLE:
                return alloc->make<LiteralString>(
                    span(tok), tok.fodder, tok.data32(), LiteralString::VERBATIM_DOUBLE, "", "");

            case Token::FALSE: return alloc->make<LiteralBoolean>(span(tok), tok.fodder, false);

            case Token::TRUE: return alloc->make<LiteralBoolean>(span(tok), tok.fodder, true);

            case Token::NULL_LIT: return alloc->make<LiteralNull>(span(tok), tok.fodder);

            // Variables
            case Token::DOLLAR: return alloc->make<Dollar>(span(tok), tok.fodder);

            case Token::IDENTIFIER:
                return alloc->make<Var>(span(tok), tok.fodder, alloc->makeIdentifier(tok.data32()));

            case Token::SELF: return alloc->make<Self>(span(tok), tok.fodder);

            case Token::SUPER: {
                Token next = pop();
                AST *index = nullptr;
                const Identifier *id = nullptr;
                Fodder id_fodder;
                switch (next.kind) {
                    case Token::DOT: {
                        Token field_id = popExpect(Token::IDENTIFIER);
                        id_fodder = field_id.fodder;
                        id = alloc->makeIdentifier(field_id.data32());
                    } break;
                    case Token::BRACKET_L: {
                        index = parse(MAX_PRECEDENCE);
                        Token bracket_r = popExpect(Token::BRACKET_R);
                        id_fodder = bracket_r.fodder;  // Not id_fodder, but use the same var.
                    } break;
                    default: throw StaticError(tok.location, "expected . or [ after super.");
                }
                return alloc->make<SuperIndex>(
                    span(tok), tok.fodder, next.fodder, index, id_fodder, id);
            }
        }

        std::cerr << "INTERNAL ERROR: Unknown tok kind: " << tok.kind << std::endl;
        std::abort();
        return nullptr;  // Quiet, compiler.
    }